

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GLSL420Pack::ConstAssignmentTest::prepareNextTestCase
          (ConstAssignmentTest *this,GLuint test_case_index)

{
  GLuint test_case_index_local;
  ConstAssignmentTest *this_local;
  
  this->m_current_test_case_index = test_case_index;
  if (test_case_index == 0xffffffff) {
    this_local._7_1_ = true;
  }
  else if (test_case_index < 2) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ConstAssignmentTest::prepareNextTestCase(glw::GLuint test_case_index)
{
	m_current_test_case_index = test_case_index;

	if ((glw::GLuint)-1 == test_case_index)
	{
		return true;
	}
	else if (2 <= test_case_index)
	{
		return false;
	}

	return true;
}